

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trapezoidal_decomposition.cc
# Opt level: O0

void __thiscall
PolygonTriangulation::update_xsplit_trapezoid_neighbors
          (PolygonTriangulation *this,MergeSide_t side,uint32_t left_trap_index,
          uint32_t right_trap_index)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  uint32_t local_88;
  uint32_t local_84;
  uint32_t local_7c;
  uint32_t local_78;
  value_type *right_below;
  value_type *left_below;
  value_type *below;
  value_type *below1;
  value_type *right_below1;
  value_type *right_trap;
  value_type *left_trap;
  uint32_t right_trap_index_local;
  uint32_t left_trap_index_local;
  MergeSide_t side_local;
  PolygonTriangulation *this_local;
  
  pvVar2 = std::
           vector<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
           ::operator[](&this->trapezoids_,(ulong)left_trap_index);
  pvVar3 = std::
           vector<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
           ::operator[](&this->trapezoids_,(ulong)right_trap_index);
  if (side == MergeLeft) {
    pvVar4 = std::
             vector<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
             ::operator[](&this->trapezoids_,(ulong)pvVar2->below1);
    update_trapezoid_aboves(this,left_trap_index,pvVar4);
    if (pvVar2->below2 != 0xffffffff) {
      pvVar4 = std::
               vector<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
               ::operator[](&this->trapezoids_,(ulong)pvVar2->below2);
      update_trapezoid_aboves(this,left_trap_index,pvVar4);
    }
    pvVar3->below1 = pvVar2->below1;
    pvVar3->below2 = pvVar2->below2;
    pvVar2->below2 = 0xffffffff;
    pvVar2 = std::
             vector<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
             ::operator[](&this->trapezoids_,(ulong)pvVar3->below1);
    pvVar2->above1 = right_trap_index;
    if (pvVar3->below2 != 0xffffffff) {
      pvVar2 = std::
               vector<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
               ::operator[](&this->trapezoids_,(ulong)pvVar3->below2);
      pvVar2->above1 = right_trap_index;
    }
  }
  else if (side == MergeRight) {
    pvVar4 = std::
             vector<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
             ::operator[](&this->trapezoids_,(ulong)pvVar3->below1);
    update_trapezoid_aboves(this,right_trap_index,pvVar4);
    if (pvVar3->below2 != 0xffffffff) {
      pvVar4 = std::
               vector<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
               ::operator[](&this->trapezoids_,(ulong)pvVar3->below2);
      update_trapezoid_aboves(this,right_trap_index,pvVar4);
    }
    if (pvVar2->below2 == 0xffffffff) {
      local_78 = pvVar2->below1;
    }
    else {
      local_78 = pvVar2->below2;
    }
    pvVar3->below1 = local_78;
    pvVar3->below2 = 0xffffffff;
    pvVar3 = std::
             vector<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
             ::operator[](&this->trapezoids_,(ulong)pvVar2->below1);
    if (pvVar3->above1 == 0xffffffff) {
      local_7c = left_trap_index;
      if (left_trap_index == pvVar3->above2) {
        local_7c = pvVar3->above1;
      }
      pvVar3->above1 = local_7c;
    }
    else {
      pvVar3->above2 = left_trap_index;
    }
    if (pvVar2->below2 != 0xffffffff) {
      pvVar2 = std::
               vector<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
               ::operator[](&this->trapezoids_,(ulong)pvVar2->below2);
      pvVar2->above1 = left_trap_index;
    }
  }
  else {
    if (pvVar3->below2 == 0xffffffff) {
      local_84 = pvVar3->below1;
    }
    else {
      local_84 = pvVar3->below2;
    }
    pvVar3->below1 = local_84;
    pvVar2->below2 = 0xffffffff;
    pvVar3->below2 = 0xffffffff;
    if (pvVar2->below1 == pvVar3->below1) {
      pvVar4 = std::
               vector<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
               ::operator[](&this->trapezoids_,(ulong)pvVar2->below1);
      bVar1 = is_bottom_triangle(this,pvVar2);
      if (bVar1) {
        pvVar2->below1 = 0xffffffff;
        pvVar2->below2 = 0xffffffff;
        pvVar4->above2 = right_trap_index;
      }
      else {
        bVar1 = is_bottom_triangle(this,pvVar3);
        if (bVar1) {
          pvVar3->below1 = 0xffffffff;
          pvVar3->below2 = 0xffffffff;
          pvVar4->above1 = left_trap_index;
          if (right_trap_index == pvVar4->above2) {
            local_88 = 0xffffffff;
          }
          else {
            local_88 = pvVar4->above2;
          }
          pvVar4->above2 = local_88;
        }
        else {
          pvVar4->above1 = left_trap_index;
          pvVar4->above2 = right_trap_index;
        }
      }
    }
    else {
      pvVar2 = std::
               vector<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
               ::operator[](&this->trapezoids_,(ulong)pvVar2->below1);
      pvVar2->above1 = left_trap_index;
      pvVar2->above2 = 0xffffffff;
      pvVar2 = std::
               vector<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
               ::operator[](&this->trapezoids_,(ulong)pvVar3->below1);
      pvVar2->above1 = right_trap_index;
      pvVar2->above2 = 0xffffffff;
    }
  }
  return;
}

Assistant:

void PolygonTriangulation::update_xsplit_trapezoid_neighbors(const MergeSide_t side,
                                                             const uint32_t left_trap_index,
                                                             const uint32_t right_trap_index)
{
  auto &left_trap = trapezoids_[left_trap_index];
  auto &right_trap = trapezoids_[right_trap_index];

  // We need 'belows' to compute trapezoids and for monotonization,
  // we need 'aboves' only for monotonization.

  if (side == MergeLeft) {

    update_trapezoid_aboves(left_trap_index, trapezoids_[left_trap.below1]);
    if (kInvalidIndex != left_trap.below2) {
      update_trapezoid_aboves(left_trap_index, trapezoids_[left_trap.below2]);
    }

    // ---------

    right_trap.below1 = left_trap.below1;
    right_trap.below2 = left_trap.below2;
    left_trap.below2 = kInvalidIndex;

    auto &right_below1 = trapezoids_[right_trap.below1];
    right_below1.above1 = right_trap_index;

    if (kInvalidIndex != right_trap.below2) {
      trapezoids_[right_trap.below2].above1 = right_trap_index;
    }
  } else if (side == MergeRight) {

    update_trapezoid_aboves(right_trap_index, trapezoids_[right_trap.below1]);
    if (kInvalidIndex != right_trap.below2) {
      update_trapezoid_aboves(right_trap_index, trapezoids_[right_trap.below2]);
    }

    // ---------

    right_trap.below1 = (kInvalidIndex != left_trap.below2) ? left_trap.below2 : left_trap.below1;
    right_trap.below2 = kInvalidIndex;

    auto &below1 = trapezoids_[left_trap.below1];
    if (below1.above1 == kInvalidIndex) {
      below1.above1 = (left_trap_index != below1.above2) ? left_trap_index : below1.above1; //
    } else {
      below1.above2 = left_trap_index;
    }

    if (kInvalidIndex != left_trap.below2) {
      trapezoids_[left_trap.below2].above1 = left_trap_index;
    }
  } else {
    right_trap.below1 = (kInvalidIndex != right_trap.below2) ? right_trap.below2 : right_trap.below1;
    left_trap.below2 = kInvalidIndex;
    right_trap.below2 = kInvalidIndex;

    // When we close the last trapezoid the below trapezoid has 2 aboves,
    // unless the vertex is already segmented.
    if (left_trap.below1 == right_trap.below1) {
      // 1) The below trapezoid is unsegmented.

      // close the trapezoid
      auto &below = trapezoids_[left_trap.below1];
      if (is_bottom_triangle(left_trap)) {
        left_trap.below1 = kInvalidIndex;
        left_trap.below2 = kInvalidIndex;
        below.above2 = right_trap_index;
      } else if (is_bottom_triangle(right_trap)) {
        right_trap.below1 = kInvalidIndex;
        right_trap.below2 = kInvalidIndex;
        below.above1 = left_trap_index;
        below.above2 = (right_trap_index != below.above2) ? below.above2 : kInvalidIndex;
      } else {
        below.above1 = left_trap_index;
        below.above2 = right_trap_index;
      }
    } else {
      // 2) The below trapezoid is segmented.

      auto &left_below = trapezoids_[left_trap.below1];
      left_below.above1 = left_trap_index;
      left_below.above2 = kInvalidIndex;

      auto &right_below = trapezoids_[right_trap.below1];
      right_below.above1 = right_trap_index;
      right_below.above2 = kInvalidIndex;
    }
  }
}